

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void tcmalloc::ThreadCache::InitModule(void)

{
  bool bVar1;
  SpinLock *l;
  char *__nptr;
  size_t new_size;
  char *tcb;
  SpinLockHolder local_10;
  SpinLockHolder h;
  
  l = Static::pageheap_lock();
  SpinLockHolder::SpinLockHolder(&local_10,l);
  if ((phinited & 1) == 0) {
    __nptr = TCMallocGetenvSafe("TCMALLOC_MAX_TOTAL_THREAD_CACHE_BYTES");
    if (__nptr != (char *)0x0) {
      new_size = strtoll(__nptr,(char **)0x0,10);
      set_overall_thread_cache_size(new_size);
    }
    Static::InitStaticVars();
    PageHeapAllocator<tcmalloc::ThreadCache>::Init
              ((PageHeapAllocator<tcmalloc::ThreadCache> *)threadcache_allocator);
    SetupMallocExtension();
    phinited = 1;
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  SpinLockHolder::~SpinLockHolder(&local_10);
  if (!bVar1) {
    Static::InitLateMaybeRecursive();
  }
  return;
}

Assistant:

void ThreadCache::InitModule() {
  {
    SpinLockHolder h(Static::pageheap_lock());
    if (phinited) {
      return;
    }
    const char *tcb = TCMallocGetenvSafe("TCMALLOC_MAX_TOTAL_THREAD_CACHE_BYTES");
    if (tcb) {
      set_overall_thread_cache_size(strtoll(tcb, nullptr, 10));
    }
    Static::InitStaticVars();
    threadcache_allocator.Init();
    SetupMallocExtension();
    phinited = 1;
  }

  // We do "late" part of initialization without holding lock since
  // there is chance it'll recurse into malloc
  Static::InitLateMaybeRecursive();

#ifndef NDEBUG
  // pthread_atfork above may malloc sometimes. Lets ensure we test
  // that malloc works from here.
  (operator delete)((operator new)(1));
#endif
}